

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  runtime_error *err;
  undefined1 local_110 [8];
  Args args;
  char **argv_local;
  int argc_local;
  
  args.unhasher.super___shared_ptr<std::optional<ritobin::BinUnhasher>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  Args::Args((Args *)local_110,argc,argv);
  Args::run((Args *)local_110);
  Args::~Args((Args *)local_110);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    try {
        auto args = Args(argc, argv);
        args.run();
        return 0;
    } catch (const std::runtime_error& err) {
        std::cerr << err.what() << std::endl;
        return -1;
    }
}